

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoBinop<double,double>(Thread *this,BinopFunc<double,_double> *f)

{
  double value;
  Value VVar1;
  Value VVar2;
  
  VVar1 = Pop(this);
  VVar2 = Pop(this);
  value = (*f)((double)VVar2.field_0.i64_,(double)VVar1.field_0.i64_);
  Push<double>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoBinop(BinopFunc<R, T> f) {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  Push<R>(f(lhs, rhs));
  return RunResult::Ok;
}